

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.cc
# Opt level: O3

void __thiscall
VW::config::options_serializer_boost_po::add_impl<VW::config::typelist<>>
          (options_serializer_boost_po *this,base_option *param_1)

{
  vw_exception *this_00;
  stringstream __msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_190,"That is an unsupported option type.",0x23);
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/options_serializer_boost_po.cc"
             ,0x19,&local_1c0);
  __cxa_throw(this_00,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

void options_serializer_boost_po::add_impl<typelist<>>(base_option&)
{
  THROW("That is an unsupported option type.");
}